

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O3

bool __thiscall EMWINHandler::extractTimeStamp(EMWINHandler *this,string *text,timespec *ts)

{
  pointer pcVar1;
  char *__s;
  char *pcVar2;
  time_t tVar3;
  bool bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  tm tm;
  string local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  tm local_58;
  
  pcVar1 = (text->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + text->_M_string_length);
  util::split(&local_70,&local_90,'_');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((ulong)((long)local_70.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_70.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x81) {
    bVar4 = false;
  }
  else {
    __s = local_70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    pcVar2 = strptime(__s,"%Y%m%d%H%M%S",&local_58);
    bVar4 = pcVar2 == __s + 0xe;
    if (bVar4) {
      tVar3 = mktime(&local_58);
      ts->tv_sec = tVar3;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return bVar4;
}

Assistant:

bool EMWINHandler::extractTimeStamp(
    const std::string& text,
    struct timespec& ts) const {
  auto parts = split(text, '_');
  if (parts.size() < 5) {
    return false;
  }

  const char* buf = parts[4].c_str();
  const char* format = "%Y%m%d%H%M%S";
  struct tm tm;
  auto ptr = strptime(buf, format, &tm);

  // Only use time if strptime was successful
  if (ptr != (buf + 14)) {
    return false;
  }

  ts.tv_sec = mktime(&tm);
  return true;
}